

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.cc
# Opt level: O1

void drawFaces(Mat *img,vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *faces)

{
  pointer pRVar1;
  ulong uVar2;
  long lVar3;
  long *local_78;
  undefined8 uStack_70;
  long local_68 [2];
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  _InputArray local_48;
  
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"draw faces","");
  cv::namedWindow((string *)&local_78,1);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  pRVar1 = (faces->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((faces->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl.
      super__Vector_impl_data._M_finish != pRVar1) {
    lVar3 = 0xc;
    uVar2 = 0;
    do {
      local_50 = *(int *)((long)pRVar1 + lVar3 + -4) / 2 + *(int *)((long)pRVar1 + lVar3 + -0xc);
      local_4c = *(int *)((long)&pRVar1->x + lVar3) / 2 + *(int *)((long)pRVar1 + lVar3 + -8);
      local_48.sz.width = 0;
      local_48.sz.height = 0;
      local_48.flags = 0x3010000;
      local_58 = *(int *)((long)pRVar1 + lVar3 + -4) / 2;
      local_54 = (int)((double)*(int *)((long)&pRVar1->x + lVar3) / 1.5);
      local_78 = (long *)0x0;
      uStack_70 = 0x406fe00000000000;
      local_68[0] = 0;
      local_68[1] = 0;
      local_48.obj = img;
      cv::ellipse(0,0,0x4076800000000000,&local_48,&local_50,&local_58,&local_78,2,8,0);
      uVar2 = uVar2 + 1;
      pRVar1 = (faces->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>)._M_impl
               .super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < (ulong)((long)(faces->
                                   super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 4))
    ;
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"draw faces","");
  local_48.sz.width = 0;
  local_48.sz.height = 0;
  local_48.flags = 0x1010000;
  local_48.obj = img;
  cv::imshow((string *)&local_78,&local_48);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return;
}

Assistant:

void drawFaces(Mat img, vector<Rect> faces) {
  namedWindow("draw faces");
  for (size_t i = 0; i < faces.size(); i++) {
    // 先确定人脸矩形中心坐标,再根据该坐标画椭圆
    Point center(faces[i].x + faces[i].width / 2,
                 faces[i].y + faces[i].height / 2);
    ellipse(img, center, Size(faces[i].width / 2, faces[i].height / 1.5), 0, 0,
            360, Scalar(0, 255, 0), 2, 8, 0);
  }
  imshow("draw faces", img);
}